

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUFA.cpp
# Opt level: O0

Expression * __thiscall
wasm::anon_unknown_234::GUFAOptimizer::replaceCurrent(GUFAOptimizer *this,Expression *rep)

{
  ContentOracle *this_00;
  Expression *pEVar1;
  mapped_type *this_01;
  PossibleContents local_38;
  Expression *local_18;
  Expression *rep_local;
  GUFAOptimizer *this_local;
  
  this_00 = this->oracle;
  local_18 = rep;
  rep_local = (Expression *)this;
  pEVar1 = Walker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
           ::getCurrent(&(this->
                         super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
                         ).
                         super_PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
                         .
                         super_Walker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
                       );
  ContentOracle::getContents(&local_38,this_00,pEVar1);
  this_01 = std::
            unordered_map<wasm::Expression_*,_wasm::PossibleContents,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::PossibleContents>_>_>
            ::operator[](&this->newContents,&local_18);
  PossibleContents::operator=(this_01,&local_38);
  PossibleContents::~PossibleContents(&local_38);
  pEVar1 = Walker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
           ::replaceCurrent(&(this->
                             super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
                             ).
                             super_PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
                             .
                             super_Walker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
                            ,local_18);
  return pEVar1;
}

Assistant:

Expression* replaceCurrent(Expression* rep) {
    newContents[rep] = oracle.getContents(getCurrent());

    return WalkerPass<
      PostWalker<GUFAOptimizer,
                 UnifiedExpressionVisitor<GUFAOptimizer>>>::replaceCurrent(rep);
  }